

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

bool __thiscall
TestClass::SyncRetFunc8
          (TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3,CopyCounterGuy *ccg1,uint8_t *p4,
          int64_t *p5,int32_t *p6,int16_t *p7)

{
  ulong uVar1;
  SyncRetEventAgent8<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&,_long_&,_int_&,_short_&>
  *this_00;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  uint param2;
  SyncRetEventAgent8<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&,_long_&,_int_&,_short_&>
  *agent;
  bool result;
  uint8_t *p4_local;
  CopyCounterGuy *ccg1_local;
  uint16_t *p3_local;
  uint32_t p2_local;
  uint64_t *p1_local;
  TestClass *this_local;
  
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent8<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&,_long_&,_int_&,_short_&>
               *)operator_new(0x70,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                              ,0x198);
    __n = 0;
    param2 = (uint)p1;
    SyncRetEventAgent8<TestClass,_bool,_unsigned_long_&,_unsigned_int,_unsigned_short_&,_TestClass::CopyCounterGuy_&,_unsigned_char_&,_long_&,_int_&,_short_&>
    ::SyncRetEventAgent8
              (this_00,this,0x10db40,(unsigned_long *)0x0,param2,(unsigned_short *)(ulong)p2,
               (CopyCounterGuy *)p3,(uchar *)ccg1,(long *)p4,(int *)p5,(short *)p6);
    sVar2 = SyncRetEventAgent<bool>::send
                      ((SyncRetEventAgent<bool> *)this_00,(int)this + 8,__buf,__n,param2);
    this_local._7_1_ = (bool)((byte)sVar2 & 1);
  }
  else {
    *p1 = *p1 + 0x400;
    *p3 = *p3 + 0x100;
    *p4 = *p4 + '\x10';
    *p5 = *p5 + -0x400;
    *p6 = *p6 + -0x200;
    *p7 = *p7 + -0x100;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SyncRetFunc8(uint64_t& p1, uint32_t p2, uint16_t& p3, CopyCounterGuy& ccg1, uint8_t& p4, int64_t& p5, int32_t &p6, int16_t &p7)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result;
			SyncRetEventAgent8<TestClass, bool, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t &, int64_t&, int32_t&, int16_t&>* agent =
				jh_new SyncRetEventAgent8<TestClass, bool, uint64_t &, uint32_t, uint16_t &, CopyCounterGuy &, uint8_t&, int64_t&, int32_t&, int16_t&>(this, &TestClass::SyncRetFunc8,
				p1, p2, p3, ccg1, p4, p5, p6, p7);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u) p5(%lld) p6(%d) p7(%d)", result, p1, p2, p3, ccg1.getCount(), p4, p5, p6, p7);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u) ccg1(%d) p4(%u) p5(%lld) p6(%d) p7(%d)", p1, p2, p3, ccg1.getCount(), p4, p5, p6, p7);
		p1+=1024;
		p2+=512;
		p3+=256;
		p4+=16;
		p5-=1024;
		p6-=512;
		p7-=256;
		return true;
	}